

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O2

void __thiscall
pbrt::Integrator::Integrator
          (Integrator *this,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights)

{
  pointer pLVar1;
  LightHandle *light;
  pointer this_00;
  undefined1 auVar2 [16];
  Bounds3f local_48;
  
  this->_vptr_Integrator = (_func_int **)&PTR__Integrator_02eeea88;
  (this->aggregate).
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = 0;
  (this->aggregate).
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = (aggregate->
          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
          ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector(&this->lights,lights);
  (this->infiniteLights).super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->infiniteLights).super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->infiniteLights).super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits & 0xffffffffffff) == 0) {
    auVar2._8_4_ = 0xff7fffff;
    auVar2._0_8_ = 0xff7fffffff7fffff;
    auVar2._12_4_ = 0xff7fffff;
    local_48.pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    local_48.pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
    local_48.pMin.super_Tuple3<pbrt::Point3,_float>.z = 3.4028235e+38;
    local_48.pMax.super_Tuple3<pbrt::Point3,_float>.x = -3.4028235e+38;
    local_48.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_ = vmovlps_avx(auVar2);
  }
  else {
    PrimitiveHandle::Bounds(&local_48,aggregate);
  }
  if (LOGGING_LogLevel < 1) {
    Log<pbrt::Bounds3<float>&>
              (Verbose,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.h"
               ,0x49,"Scene bounds %s",&local_48);
  }
  pLVar1 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pLVar1; this_00 = this_00 + 1
      ) {
    LightHandle::Preprocess(this_00,&local_48);
    if (*(int *)((this_00->
                 super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                 ).bits & 0xffffffffffff) == 3) {
      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::push_back
                (&this->infiniteLights,this_00);
    }
  }
  return;
}

Assistant:

Integrator(PrimitiveHandle aggregate, std::vector<LightHandle> lights)
        : aggregate(aggregate), lights(lights) {
        // Integrator constructor implementation
        Bounds3f sceneBounds = aggregate ? aggregate.Bounds() : Bounds3f();
        LOG_VERBOSE("Scene bounds %s", sceneBounds);
        for (auto &light : lights) {
            light.Preprocess(sceneBounds);
            if (light.Type() == LightType::Infinite)
                infiniteLights.push_back(light);
        }
    }